

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLDateTime::parseDay(XMLDateTime *this)

{
  bool bVar1;
  int iVar2;
  SchemaDateTimeException *pSVar3;
  XMLCh *local_38;
  int pos;
  XMLDateTime *this_local;
  
  bVar1 = initParser(this);
  if (!bVar1) {
    pSVar3 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    if (this->fBuffer == (XMLCh *)0x0) {
      local_38 = L"";
    }
    else {
      local_38 = this->fBuffer;
    }
    SchemaDateTimeException::SchemaDateTimeException
              (pSVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x29a,DateTime_gDay_invalid,local_38,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    __cxa_throw(pSVar3,&SchemaDateTimeException::typeinfo,
                SchemaDateTimeException::~SchemaDateTimeException);
  }
  if (((*this->fBuffer == L'-') && (this->fBuffer[1] == L'-')) && (this->fBuffer[2] == L'-')) {
    this->fValue[0] = 2000;
    this->fValue[1] = 1;
    iVar2 = parseInt(this,this->fStart + 3,this->fStart + 5);
    this->fValue[2] = iVar2;
    if (5 < this->fEnd) {
      iVar2 = XMLString::indexOf(L"Z+-",this->fBuffer[5]);
      if (iVar2 == -1) {
        pSVar3 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
        SchemaDateTimeException::SchemaDateTimeException
                  (pSVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                   ,0x2b3,DateTime_gDay_invalid,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0
                   ,this->fMemoryManager);
        __cxa_throw(pSVar3,&SchemaDateTimeException::typeinfo,
                    SchemaDateTimeException::~SchemaDateTimeException);
      }
      this->fValue[7] = iVar2 + 1;
      getTimeZone(this,5);
    }
    validateDateTime(this);
    normalize(this);
    return;
  }
  pSVar3 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
  SchemaDateTimeException::SchemaDateTimeException
            (pSVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
             ,0x2a3,DateTime_gDay_invalid,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
             this->fMemoryManager);
  __cxa_throw(pSVar3,&SchemaDateTimeException::typeinfo,
              SchemaDateTimeException::~SchemaDateTimeException);
}

Assistant:

void XMLDateTime::parseDay()
{
    if (!initParser())
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_gDay_invalid
                , fBuffer ? fBuffer : XMLUni::fgZeroLenString
                , fMemoryManager);

    if (fBuffer[0] != DATE_SEPARATOR ||
        fBuffer[1] != DATE_SEPARATOR ||
        fBuffer[2] != DATE_SEPARATOR  )
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_gDay_invalid
                , fBuffer
                , fMemoryManager);
    }

    //initialize values
    fValue[CentYear] = YEAR_DEFAULT;
    fValue[Month]    = MONTH_DEFAULT;
    fValue[Day]      = parseInt(fStart+3, fStart+5);

    if ( DAY_SIZE < fEnd )
    {
        int pos = XMLString::indexOf(UTC_SET, fBuffer[DAY_SIZE]);
        if (pos == -1 )
        {
            ThrowXMLwithMemMgr1(SchemaDateTimeException
                    , XMLExcepts::DateTime_gDay_invalid
                    , fBuffer
                    , fMemoryManager);
        }
        else
        {
            fValue[utc] = pos+1;
            getTimeZone(DAY_SIZE);
        }
    }

    validateDateTime();
    normalize();
}